

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzerResults.cpp
# Opt level: O3

void __thiscall
SMBusAnalyzerResults::AddResultStringsFromVector
          (SMBusAnalyzerResults *this,string *prefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v,string *postfix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *results)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long *plVar4;
  undefined8 *puVar5;
  size_type *psVar6;
  pointer pbVar7;
  _Alloc_hider _Var8;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string *local_80;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_80 = postfix;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(results);
  paVar1 = &local_70.field_2;
  pcVar3 = (prefix->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&local_70)
  ;
  local_78 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  pbVar7 = (v->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (pbVar7 != (v->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    paVar2 = &local_a0.field_2;
    do {
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)(pbVar7->_M_dataplus)._M_p);
      pbVar7 = pbVar7 + 1;
      if ((pbVar7 < (v->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) ||
         (local_80->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)&local_70);
        std::operator+(&local_50,prefix,&local_70);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_a0.field_2._M_allocated_capacity = *psVar6;
          local_a0.field_2._8_8_ = plVar4[3];
          local_a0._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar6;
          local_a0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_a0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_78,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        _Var8._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_0010b1fe;
      }
      else {
        std::operator+(&local_a0,prefix,&local_70);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_78,&local_a0);
        _Var8._M_p = local_a0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar2) {
LAB_0010b1fe:
          operator_delete(_Var8._M_p);
        }
      }
    } while (pbVar7 != (v->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_80->_M_string_length != 0) {
    std::operator+(&local_50,prefix,&local_70);
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_50,(ulong)(local_80->_M_dataplus)._M_p);
    psVar6 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_a0.field_2._M_allocated_capacity = *psVar6;
      local_a0.field_2._8_8_ = puVar5[3];
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar6;
      local_a0._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_a0._M_string_length = puVar5[1];
    *puVar5 = psVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_78,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SMBusAnalyzerResults::AddResultStringsFromVector( const std::string& prefix, const std::vector<std::string>& v,
                                                       const std::string& postfix, std::vector<std::string>& results )
{
    results.clear();

    results.push_back( prefix + "..." );

    std::string str;
    for( std::vector<std::string>::const_iterator vi( v.begin() ); vi != v.end(); ++vi )
    {
        str += *vi;

        if( vi + 1 < v.end() || !postfix.empty() )
        {
            str += ", ";
            results.push_back( prefix + str + "..." );
        }
        else
        {
            results.push_back( prefix + str );
        }
    }

    if( !postfix.empty() )
        results.push_back( prefix + str + postfix );
}